

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPrimal.cpp
# Opt level: O0

void __thiscall HPrimal::primalChooseColumn(HPrimal *this)

{
  double dVar1;
  int *piVar2;
  int *piVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  long in_RDI;
  int iCol;
  double dualTolerance;
  double *workUpper;
  double *workLower;
  double *workDual;
  int *jMove;
  int *jFlag;
  double bestInfeas;
  int local_44;
  double local_10;
  
  *(undefined4 *)(in_RDI + 0x38) = 0xffffffff;
  local_10 = 0.0;
  piVar2 = HModel::getNonbasicFlag((HModel *)0x188f4c);
  piVar3 = HModel::getNonbasicMove((HModel *)0x188f62);
  pdVar4 = HModel::getWorkDual((HModel *)0x188f78);
  pdVar5 = HModel::getWorkLower((HModel *)0x188f8e);
  pdVar6 = HModel::getWorkUpper((HModel *)0x188fa4);
  dVar1 = *(double *)(*(long *)(in_RDI + 0x18) + 0x30);
  local_44 = 0;
  do {
    if (*(int *)(in_RDI + 0x28) <= local_44) {
      return;
    }
    if ((piVar2[local_44] != 0) && (dVar1 < ABS(pdVar4[local_44]))) {
      if ((pdVar5[local_44] == -1e+200) &&
         (((!NAN(pdVar5[local_44]) && (pdVar6[local_44] == 1e+200)) && (!NAN(pdVar6[local_44]))))) {
        *(int *)(in_RDI + 0x38) = local_44;
        return;
      }
      if (((double)piVar3[local_44] * pdVar4[local_44] < -dVar1) &&
         (local_10 < ABS(pdVar4[local_44]))) {
        local_10 = ABS(pdVar4[local_44]);
        *(int *)(in_RDI + 0x38) = local_44;
      }
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

void HPrimal::primalChooseColumn() {
    columnIn = -1;
    double bestInfeas = 0;
    const int *jFlag = model->getNonbasicFlag();
    const int *jMove = model->getNonbasicMove();
    double *workDual = model->getWorkDual();
    const double *workLower = model->getWorkLower();
    const double *workUpper = model->getWorkUpper();
    const double dualTolerance = model->dblOption[DBLOPT_DUAL_TOL];

    for (int iCol = 0; iCol < numTot; iCol++) {
        if (jFlag[iCol] && fabs(workDual[iCol]) > dualTolerance) {
            // Always take free
            // TODO: if we found free,
            // Then deal with it in dual phase 1
            if (workLower[iCol] == -HSOL_CONST_INF
                    && workUpper[iCol] == HSOL_CONST_INF) {
                columnIn = iCol;
                break;
            }
            // Then look at dual infeasible
            if (jMove[iCol] * workDual[iCol] < -dualTolerance) {
                if (bestInfeas < fabs(workDual[iCol])) {
                    bestInfeas = fabs(workDual[iCol]);
                    columnIn = iCol;
                }
            }
        }
    }
}